

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

bool __thiscall Memory::HeapBlockMap32::TestAndSetMark(HeapBlockMap32 *this,void *address)

{
  L2MapChunk *this_00;
  BOOLEAN BVar1;
  uint uVar2;
  uint bitIndex;
  L2MapChunk *chunk;
  uint id1;
  void *address_local;
  HeapBlockMap32 *this_local;
  
  uVar2 = GetLevel1Id(address);
  this_00 = this->map[uVar2];
  if (this_00 == (L2MapChunk *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = L2MapChunk::GetMarkBitIndex(address);
    BVar1 = BVStatic<65536UL>::TestAndSet(&this_00->markBits,uVar2);
    this_local._7_1_ = BVar1 != '\0';
  }
  return this_local._7_1_;
}

Assistant:

bool
HeapBlockMap32::TestAndSetMark(void * address)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * chunk = map[id1];
    if (chunk == nullptr)
    {
        // False reference
        return false;
    }

    uint bitIndex = chunk->GetMarkBitIndex(address);
    return (chunk->markBits.TestAndSet(bitIndex) != 0);
}